

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransporthttp.c
# Opt level: O0

int IoTHubTransportHttp_GetSupportedPlatformInfo
              (TRANSPORT_LL_HANDLE handle,PLATFORM_INFO_OPTION *info)

{
  undefined4 local_1c;
  int result;
  PLATFORM_INFO_OPTION *info_local;
  TRANSPORT_LL_HANDLE handle_local;
  
  if (handle == (TRANSPORT_LL_HANDLE)0x0) {
    local_1c = 0x8d8;
  }
  else {
    *info = PLATFORM_INFO_OPTION_DEFAULT;
    local_1c = 0;
  }
  return local_1c;
}

Assistant:

static int IoTHubTransportHttp_GetSupportedPlatformInfo(TRANSPORT_LL_HANDLE handle, PLATFORM_INFO_OPTION* info)
{
    int result;
    if (handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        *info = PLATFORM_INFO_OPTION_DEFAULT;
        result = 0;
    }

    return result;
}